

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::
TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
::TypedExpectation(TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
                   *this,FunctionMocker<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
                         *owner,char *a_file,int a_line,string *a_source_text,
                  ArgumentMatcherTuple *m)

{
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002f9950;
  this->owner_ = owner;
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
  ::_Tuple_impl(&(this->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
                ,&m->
                  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
               );
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int>_&>
  .vtable_ = (VTable *)
             MatcherBase<std::tuple<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>const&,int,unsigned_int>const&>
             ::
             GetVTable<testing::internal::MatcherBase<std::tuple<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>const&,int,unsigned_int>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
             ::kVTable;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tuple<const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002f9998;
  *(undefined8 *)&(this->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (this->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

TypedExpectation(FunctionMocker<F>* owner, const char* a_file, int a_line,
                   const std::string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that causes ambiguity between
        // Matcher's copy and move constructor for some argument types.
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}